

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

WriteBatch * __thiscall leveldb::DBImpl::BuildBatchGroup(DBImpl *this,Writer **last_writer)

{
  long lVar1;
  Writer *pWVar2;
  Writer *pWVar3;
  int iVar4;
  ulong uVar5;
  WriteBatch *b;
  _Map_pointer pppWVar6;
  WriteBatch *src;
  ulong uVar7;
  _Elt_pointer ppWVar8;
  _Elt_pointer ppWVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppWVar9 = (this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->writers_).
      super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur == ppWVar9) {
    __assert_fail("!writers_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x4f9,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
  }
  pWVar2 = *ppWVar9;
  b = pWVar2->batch;
  if (b == (WriteBatch *)0x0) {
    __assert_fail("result != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x4fc,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
  }
  uVar7 = (b->rep_)._M_string_length;
  uVar5 = 0x100000;
  if (uVar7 < 0x20001) {
    uVar5 = uVar7 + 0x20000;
  }
  *last_writer = pWVar2;
  ppWVar9 = (this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last;
  pppWVar6 = (this->writers_).
             super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppWVar8 = (this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
  if (ppWVar8 == ppWVar9) {
    ppWVar8 = pppWVar6[1];
    pppWVar6 = pppWVar6 + 1;
    ppWVar9 = ppWVar8 + 0x40;
  }
  if (ppWVar8 !=
      (this->writers_).
      super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur) {
    do {
      pWVar3 = *ppWVar8;
      if ((pWVar3->sync == true) && (pWVar2->sync != true)) break;
      src = pWVar3->batch;
      if (src != (WriteBatch *)0x0) {
        uVar7 = uVar7 + (src->rep_)._M_string_length;
        if (uVar5 < uVar7) break;
        if (b == pWVar2->batch) {
          b = this->tmp_batch_;
          iVar4 = WriteBatchInternal::Count(b);
          if (iVar4 != 0) {
            __assert_fail("WriteBatchInternal::Count(result) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                          ,0x51d,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
          }
          WriteBatchInternal::Append(b,pWVar2->batch);
          src = pWVar3->batch;
        }
        WriteBatchInternal::Append(b,src);
      }
      *last_writer = pWVar3;
      ppWVar8 = ppWVar8 + 1;
      if (ppWVar8 == ppWVar9) {
        ppWVar8 = pppWVar6[1];
        pppWVar6 = pppWVar6 + 1;
        ppWVar9 = ppWVar8 + 0x40;
      }
    } while (ppWVar8 !=
             (this->writers_).
             super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return b;
}

Assistant:

WriteBatch* DBImpl::BuildBatchGroup(Writer** last_writer) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  Writer* first = writers_.front();
  WriteBatch* result = first->batch;
  assert(result != nullptr);

  size_t size = WriteBatchInternal::ByteSize(first->batch);

  // Allow the group to grow up to a maximum size, but if the
  // original write is small, limit the growth so we do not slow
  // down the small write too much.
  size_t max_size = 1 << 20;
  if (size <= (128 << 10)) {
    max_size = size + (128 << 10);
  }

  *last_writer = first;
  std::deque<Writer*>::iterator iter = writers_.begin();
  ++iter;  // Advance past "first"
  for (; iter != writers_.end(); ++iter) {
    Writer* w = *iter;
    if (w->sync && !first->sync) {
      // Do not include a sync write into a batch handled by a non-sync write.
      break;
    }

    if (w->batch != nullptr) {
      size += WriteBatchInternal::ByteSize(w->batch);
      if (size > max_size) {
        // Do not make batch too big
        break;
      }

      // Append to *result
      if (result == first->batch) {
        // Switch to temporary batch instead of disturbing caller's batch
        result = tmp_batch_;
        assert(WriteBatchInternal::Count(result) == 0);
        WriteBatchInternal::Append(result, first->batch);
      }
      WriteBatchInternal::Append(result, w->batch);
    }
    *last_writer = w;
  }
  return result;
}